

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QStyleOptionGraphicsItem>::copyAppend
          (QGenericArrayOps<QStyleOptionGraphicsItem> *this,QStyleOptionGraphicsItem *b,
          QStyleOptionGraphicsItem *e)

{
  qsizetype *pqVar1;
  qreal *pqVar2;
  QStyleOptionGraphicsItem *pQVar3;
  long lVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  
  if ((b != e) && (b < e)) {
    pQVar3 = (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).size;
      QStyleOption::QStyleOption(&pQVar3[lVar4].super_QStyleOption,1,0xf);
      pqVar2 = &pQVar3[lVar4].exposedRect.w;
      *pqVar2 = 0.0;
      pqVar2[1] = 0.0;
      pQVar3[lVar4].exposedRect.xp = 0.0;
      pQVar3[lVar4].exposedRect.yp = 0.0;
      QStyleOption::operator=(&pQVar3[lVar4].super_QStyleOption,&b->super_QStyleOption);
      qVar5 = (b->exposedRect).yp;
      qVar6 = (b->exposedRect).w;
      qVar7 = (b->exposedRect).h;
      pQVar3[lVar4].exposedRect.xp = (b->exposedRect).xp;
      pQVar3[lVar4].exposedRect.yp = qVar5;
      pqVar2 = &pQVar3[lVar4].exposedRect.w;
      *pqVar2 = qVar6;
      pqVar2[1] = qVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }